

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMAttrNSImpl::setName(DOMAttrNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  DOMDocument *pDVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  ulong uVar10;
  undefined4 extraout_var;
  XMLCh *pXVar12;
  undefined4 extraout_var_00;
  long lVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMException *this_00;
  undefined4 extraout_var_05;
  undefined8 *puVar14;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  XMLSize_t XVar15;
  DOMStringPoolEntry *pDVar16;
  XMLCh *pXVar17;
  XMLCh XVar18;
  DOMDocumentImpl *this_01;
  int colon_count;
  XMLSize_t XVar19;
  DOMStringPoolEntry *pDVar11;
  
  pDVar4 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar4[-1].super_DOMNode;
  if (pDVar4 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  pXVar8 = DOMNodeImpl::getXmlnsString();
  pXVar9 = DOMNodeImpl::getXmlnsURIString();
  iVar7 = 0;
  if (qualifiedName == (XMLCh *)0x0) {
    pXVar17 = (XMLCh *)0x0;
  }
  else {
    lVar13 = 0;
    do {
      psVar1 = (short *)((long)qualifiedName + lVar13);
      lVar13 = lVar13 + 2;
    } while (*psVar1 != 0);
    uVar10 = (ulong)(ushort)*qualifiedName;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      XVar18 = qualifiedName[1];
      if (XVar18 != L'\0') {
        pXVar17 = qualifiedName + 2;
        do {
          uVar10 = (ulong)(ushort)XVar18 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar18 = *pXVar17;
          pXVar17 = pXVar17 + 1;
        } while (XVar18 != L'\0');
      }
      uVar10 = uVar10 % this_01->fNameTableSize;
    }
    XVar19 = (lVar13 >> 1) - 1;
    pDVar11 = this_01->fNameTable[uVar10];
    if (pDVar11 == (DOMStringPoolEntry *)0x0) {
      pDVar16 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
    }
    else {
      do {
        pDVar16 = pDVar11;
        if (pDVar16->fLength == XVar19) {
          pXVar17 = pDVar16->fString;
          if (pXVar17 == qualifiedName) goto LAB_0025c610;
          lVar13 = 0;
          do {
            psVar1 = (short *)((long)pXVar17 + lVar13);
            if (*psVar1 == 0) {
              if (*(short *)((long)qualifiedName + lVar13) == 0) goto LAB_0025c610;
              break;
            }
            psVar2 = (short *)((long)qualifiedName + lVar13);
            lVar13 = lVar13 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar11 = pDVar16->fNext;
      } while (pDVar16->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar19 * 2 + 0x18);
    pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var,iVar6);
    pDVar16->fNext = pDVar11;
    pDVar11->fLength = XVar19;
    pDVar11->fNext = (DOMStringPoolEntry *)0x0;
    pXVar17 = pDVar11->fString;
    XMLString::copyString(pXVar17,qualifiedName);
  }
LAB_0025c610:
  (this->super_DOMAttrImpl).fName = pXVar17;
  XVar19 = 0xffffffff;
  uVar10 = 0;
  do {
    if (qualifiedName[uVar10] == L':') {
      iVar7 = iVar7 + 1;
      XVar19 = uVar10 & 0xffffffff;
    }
    else if (qualifiedName[uVar10] == L'\0') break;
    uVar10 = uVar10 + 1;
  } while( true );
  if (((((int)uVar10 == 0) || (iVar6 = (int)XVar19, iVar6 == 0)) || ((int)uVar10 + -1 == iVar6)) ||
     (1 < iVar7)) {
LAB_0025cb0e:
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_04,iVar7) == 0) {
      puVar14 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
      puVar14 = (undefined8 *)(CONCAT44(extraout_var_06,iVar7) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar14);
    goto LAB_0025cbc5;
  }
  if (iVar6 == -1) {
    if (pXVar17 == pXVar8) {
LAB_0025c962:
      if (pXVar9 != namespaceURI) {
        pXVar8 = pXVar9;
        if (pXVar9 == (XMLCh *)0x0 || namespaceURI == (XMLCh *)0x0) {
          if (namespaceURI == (XMLCh *)0x0) {
            if (pXVar9 == (XMLCh *)0x0) goto LAB_0025c9f2;
LAB_0025c9ec:
            XVar18 = *pXVar8;
          }
          else {
            XVar18 = *namespaceURI;
            if (XVar18 == L'\0' && pXVar9 != (XMLCh *)0x0) goto LAB_0025c9ec;
          }
          if (XVar18 == L'\0') goto LAB_0025c9f2;
        }
        else {
          do {
            XVar18 = *namespaceURI;
            if (XVar18 == L'\0') goto LAB_0025c9ec;
            namespaceURI = namespaceURI + 1;
            XVar3 = *pXVar8;
            pXVar8 = pXVar8 + 1;
          } while (XVar18 == XVar3);
        }
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var_02,iVar7) == 0) {
          puVar14 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
          puVar14 = (undefined8 *)(CONCAT44(extraout_var_07,iVar7) + 0x158);
        }
        DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar14);
LAB_0025cbc5:
        __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
      }
LAB_0025c9f2:
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = pXVar17;
      goto LAB_0025ca06;
    }
    if ((pXVar8 == (XMLCh *)0x0) || (pXVar12 = pXVar17, pXVar17 == (XMLCh *)0x0)) {
      if (pXVar17 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) goto LAB_0025c962;
LAB_0025c925:
        XVar18 = *pXVar8;
      }
      else {
        XVar18 = *pXVar17;
        if ((pXVar8 != (XMLCh *)0x0) && (XVar18 == L'\0')) goto LAB_0025c925;
      }
      if (XVar18 == L'\0') goto LAB_0025c962;
    }
    else {
      do {
        XVar18 = *pXVar12;
        if (XVar18 == L'\0') goto LAB_0025c925;
        XVar3 = *pXVar8;
        pXVar12 = pXVar12 + 1;
        pXVar8 = pXVar8 + 1;
      } while (XVar18 == XVar3);
    }
    this->fPrefix = (XMLCh *)0x0;
    this->fLocalName = pXVar17;
    pXVar8 = (XMLCh *)0x0;
  }
  else {
    if (iVar6 < 0) goto LAB_0025cb0e;
    if (pXVar17 == (XMLCh *)0x0) {
      pXVar17 = (XMLCh *)0x0;
      pXVar8 = (XMLCh *)0x0;
    }
    else {
      uVar10 = (ulong)(ushort)*pXVar17;
      XVar15 = 0;
      do {
        uVar10 = (ulong)(ushort)pXVar17[XVar15 + 1] + (uVar10 >> 0x18) + uVar10 * 0x26;
        XVar15 = XVar15 + 1;
      } while (XVar19 != XVar15);
      uVar10 = uVar10 % this_01->fNameTableSize;
      pDVar11 = this_01->fNameTable[uVar10];
      if (pDVar11 == (DOMStringPoolEntry *)0x0) {
        pDVar16 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
      }
      else {
        do {
          pDVar16 = pDVar11;
          if (pDVar16->fLength == XVar19) {
            pXVar8 = pDVar16->fString;
            if (pXVar8 == pXVar17) goto LAB_0025c7a4;
            XVar15 = 0;
            while( true ) {
              XVar18 = pXVar8[XVar15];
              if ((XVar18 == L'\0') || (XVar18 != pXVar17[XVar15])) break;
              XVar15 = XVar15 + 1;
              if (XVar19 == XVar15) goto LAB_0025c7a4;
            }
            if (XVar18 == pXVar17[XVar15]) goto LAB_0025c7a4;
          }
          pDVar11 = pDVar16->fNext;
        } while (pDVar16->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar7 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar19 * 2 + 0x18);
      pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar7);
      pDVar16->fNext = pDVar11;
      pDVar11->fLength = XVar19;
      pDVar11->fNext = (DOMStringPoolEntry *)0x0;
      pXVar8 = pDVar11->fString;
      XMLString::copyNString(pXVar8,pXVar17,XVar19);
      pXVar17 = (this->super_DOMAttrImpl).fName;
    }
LAB_0025c7a4:
    this->fPrefix = pXVar8;
    pXVar9 = pXVar17 + XVar19 + 1;
    lVar13 = 0;
    do {
      psVar1 = (short *)((long)pXVar9 + lVar13);
      lVar13 = lVar13 + 2;
    } while (*psVar1 != 0);
    uVar10 = (ulong)(ushort)*pXVar9;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      XVar18 = pXVar17[XVar19 + 2];
      if (XVar18 != L'\0') {
        pXVar17 = pXVar17 + XVar19 + 3;
        do {
          uVar10 = (ulong)(ushort)XVar18 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar18 = *pXVar17;
          pXVar17 = pXVar17 + 1;
        } while (XVar18 != L'\0');
      }
      uVar10 = uVar10 % this_01->fNameTableSize;
    }
    XVar19 = (lVar13 >> 1) - 1;
    pDVar11 = this_01->fNameTable[uVar10];
    if (pDVar11 == (DOMStringPoolEntry *)0x0) {
      pDVar16 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
    }
    else {
      do {
        pDVar16 = pDVar11;
        if (pDVar16->fLength == XVar19) {
          pXVar17 = pDVar16->fString;
          if (pXVar17 == pXVar9) goto LAB_0025c8cc;
          lVar13 = 0;
          do {
            psVar1 = (short *)((long)pXVar17 + lVar13);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar9 + lVar13) == 0) goto LAB_0025c8cc;
              break;
            }
            psVar2 = (short *)((long)pXVar9 + lVar13);
            lVar13 = lVar13 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar11 = pDVar16->fNext;
      } while (pDVar16->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar7 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar19 * 2 + 0x18);
    pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_01,iVar7);
    pDVar16->fNext = pDVar11;
    pDVar11->fLength = XVar19;
    pDVar11->fNext = (DOMStringPoolEntry *)0x0;
    pXVar17 = pDVar11->fString;
    XMLString::copyString(pXVar17,pXVar9);
    pXVar8 = this->fPrefix;
LAB_0025c8cc:
    this->fLocalName = pXVar17;
    bVar5 = DOMDocumentImpl::isXMLName(this_01,pXVar8);
    if ((!bVar5) || (bVar5 = DOMDocumentImpl::isXMLName(this_01,this->fLocalName), !bVar5)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      if (CONCAT44(extraout_var_05,iVar7) == 0) {
        puVar14 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
        puVar14 = (undefined8 *)(CONCAT44(extraout_var_08,iVar7) + 0x158);
      }
      DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar14);
      goto LAB_0025cbc5;
    }
    pXVar8 = this->fPrefix;
  }
  pXVar9 = (XMLCh *)0x0;
  if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
    pXVar9 = namespaceURI;
  }
  pXVar9 = DOMNodeImpl::mapPrefix(pXVar8,pXVar9,2);
LAB_0025ca06:
  if (pXVar9 == (XMLCh *)0x0) {
    pXVar8 = (XMLCh *)0x0;
  }
  else {
    lVar13 = 0;
    do {
      psVar1 = (short *)((long)pXVar9 + lVar13);
      lVar13 = lVar13 + 2;
    } while (*psVar1 != 0);
    uVar10 = (ulong)(ushort)*pXVar9;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      XVar18 = pXVar9[1];
      if (XVar18 != L'\0') {
        pXVar8 = pXVar9 + 2;
        do {
          uVar10 = (ulong)(ushort)XVar18 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar18 = *pXVar8;
          pXVar8 = pXVar8 + 1;
        } while (XVar18 != L'\0');
      }
      uVar10 = uVar10 % this_01->fNameTableSize;
    }
    XVar19 = (lVar13 >> 1) - 1;
    pDVar11 = this_01->fNameTable[uVar10];
    if (pDVar11 == (DOMStringPoolEntry *)0x0) {
      pDVar16 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
    }
    else {
      do {
        pDVar16 = pDVar11;
        if (pDVar16->fLength == XVar19) {
          pXVar8 = pDVar16->fString;
          if (pXVar8 == pXVar9) goto LAB_0025cafb;
          lVar13 = 0;
          do {
            psVar1 = (short *)((long)pXVar8 + lVar13);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar9 + lVar13) == 0) goto LAB_0025cafb;
              break;
            }
            psVar2 = (short *)((long)pXVar9 + lVar13);
            lVar13 = lVar13 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar11 = pDVar16->fNext;
      } while (pDVar16->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar7 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar19 * 2 + 0x18);
    pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_03,iVar7);
    pDVar16->fNext = pDVar11;
    pDVar11->fLength = XVar19;
    pDVar11->fNext = (DOMStringPoolEntry *)0x0;
    pXVar8 = pDVar11->fString;
    XMLString::copyString(pXVar8,pXVar9);
  }
LAB_0025cafb:
  this->fNamespaceURI = pXVar8;
  return;
}

Assistant:

void DOMAttrNSImpl::setName(const XMLCh* namespaceURI, const XMLCh* qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *)fParent.fOwnerDocument;
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    bool xmlnsAlone = false;	//true if attribute name is "xmlns"
    if (index == 0)
    {	//qualifiedName contains no ':'
        if (XMLString::equals(this->fName, xmlns)) {
            if (!XMLString::equals(namespaceURI, xmlnsURI))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
            xmlnsAlone = true;
        }
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {
        fPrefix = ownerDoc->getPooledNString(fName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
            throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    const XMLCh * URI = xmlnsAlone ? xmlnsURI
        : DOMNodeImpl::mapPrefix
          (
              fPrefix,
              (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
              DOMNode::ATTRIBUTE_NODE
          );
    this -> fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}